

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

void __thiscall IsoWriter::checkLayerBreakPoint(IsoWriter *this,int maxExtentSize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  void *__s;
  int iVar4;
  int iVar5;
  size_t __n;
  
  iVar4 = (int)((ulong)(this->m_file).m_pos >> 0xb) - this->m_tagLocationBaseAddr;
  iVar1 = this->m_layerBreakPoint;
  iVar2 = iVar1 - iVar4;
  iVar5 = iVar4 + maxExtentSize;
  __n = (size_t)CONCAT31((int3)((uint)iVar5 >> 8),iVar1 < iVar5 && (iVar2 != 0 && iVar4 <= iVar1));
  if (iVar1 < iVar5 && (iVar2 != 0 && iVar4 <= iVar1)) {
    uVar3 = iVar2 * 0x800;
    __s = operator_new__((long)(int)uVar3);
    memset(__s,0,(long)(int)uVar3);
    File::write(&this->m_file,(int)__s,(void *)(ulong)uVar3,__n);
    operator_delete__(__s);
    this->m_lastWritedObjectID = -1;
  }
  return;
}

Assistant:

void IsoWriter::checkLayerBreakPoint(const int maxExtentSize)
{
    const int lbn = absoluteSectorNum();
    if (lbn < m_layerBreakPoint && lbn + maxExtentSize > m_layerBreakPoint)
    {
        const int rest = m_layerBreakPoint - lbn;
        const int size = rest * SECTOR_SIZE;
        const auto tmpBuffer = new uint8_t[size];
        memset(tmpBuffer, 0, size);
        m_file.write(tmpBuffer, size);
        delete[] tmpBuffer;
        m_lastWritedObjectID = -1;
    }
}